

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLDateTime::getYearMonth(XMLDateTime *this)

{
  int iVar1;
  int iVar2;
  SchemaDateTimeException *this_00;
  XMLSize_t end;
  
  if (this->fEnd < this->fStart + 7) {
    this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    SchemaDateTimeException::SchemaDateTimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x4a8,DateTime_ym_incomplete,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
  }
  else {
    iVar1 = indexOf(this,this->fStart + (ulong)(*this->fBuffer == L'-'),this->fEnd,L'-');
    if (iVar1 == -1) {
      this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
      SchemaDateTimeException::SchemaDateTimeException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                 ,0x4b6,DateTime_ym_invalid,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                 this->fMemoryManager);
    }
    else {
      end = (XMLSize_t)iVar1;
      iVar2 = parseIntYear(this,end);
      this->fValue[0] = iVar2;
      this->fStart = end + 1;
      if (end + 3 <= this->fEnd) {
        iVar1 = parseInt(this,end + 1,(long)(iVar1 + 3));
        this->fValue[1] = iVar1;
        this->fStart = this->fStart + 2;
        return;
      }
      this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
      SchemaDateTimeException::SchemaDateTimeException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                 ,0x4c3,DateTime_ym_noMonth,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                 this->fMemoryManager);
    }
  }
  __cxa_throw(this_00,&SchemaDateTimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLDateTime::getYearMonth()
{

    // Ensure enough chars in buffer
    if ( (fStart+YMONTH_MIN_SIZE) > fEnd)
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_ym_incomplete
                , fBuffer
                , fMemoryManager);
        //"Imcomplete YearMonth Format";

    // skip the first leading '-'
    XMLSize_t start = ( fBuffer[0] == chDash ) ? fStart + 1 : fStart;

    //
    // search for year separator '-'
    //
    int yearSeparator = indexOf(start, fEnd, DATE_SEPARATOR);
    if ( yearSeparator == NOT_FOUND)
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_ym_invalid
                , fBuffer
                , fMemoryManager);
        //("Year separator is missing or misplaced");

    fValue[CentYear] = parseIntYear(yearSeparator);
    fStart = yearSeparator + 1;  //skip the '-' and point to the first M

    //
    //gonna check we have enough byte for month
    //
    if ((fStart + 2) > fEnd )
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_ym_noMonth
                , fBuffer
                , fMemoryManager);
        //"no month in buffer"

    fValue[Month] = parseInt(fStart, yearSeparator + 3);
    fStart += 2;  //fStart points right after the MONTH

    return;
}